

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall Preprocessor::parseDefineArguments(Preprocessor *this,Macro *m)

{
  bool bVar1;
  bool bVar2;
  Token TVar3;
  char *pcVar4;
  int iVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_c0;
  Symbol arg;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<Symbol> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (Symbol *)0x0;
  do {
    if ((this->super_Parser).symbols.d.size <= (this->super_Parser).index) break;
    do {
      bVar1 = Parser::test(&this->super_Parser,PP_WHITESPACE);
    } while (bVar1);
    TVar3 = Parser::next(&this->super_Parser);
    if (TVar3 == IDENTIFIER) {
LAB_0012addf:
      arg.from = -0x5555555555555556;
      arg.len = -0x5555555555555556;
      arg.lex.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      arg.lex.d.size = -0x5555555555555556;
      arg.lineNum = -0x55555556;
      arg.token = 0xaaaaaaaa;
      arg.lex.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      Symbol::Symbol(&arg,(this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
      bVar1 = QListSpecialMethodsBase<Symbol>::contains<Symbol>
                        ((QListSpecialMethodsBase<Symbol> *)&local_58,&arg);
      if (bVar1) {
        pcVar4 = "Duplicate macro parameter.";
        goto LAB_0012af4a;
      }
      QList<Symbol>::emplaceBack<Symbol_const&>
                ((QList<Symbol> *)&local_58,
                 (this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
      do {
        bVar1 = Parser::test(&this->super_Parser,PP_WHITESPACE);
      } while (bVar1);
      TVar3 = Parser::next(&this->super_Parser);
      iVar5 = 3;
      if (TVar3 != PP_RPAREN) {
        if (TVar3 == COMMA) {
          iVar5 = 2;
        }
        else {
          Parser::lexem((QByteArray *)&local_78,&this->super_Parser);
          local_c0.d = (Data *)0x13e354;
          bVar1 = operator==((QByteArray *)&local_78,(char **)&local_c0);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
          if (!bVar1) goto LAB_0012af3a;
          m->isVariadic = true;
          do {
            bVar1 = Parser::test(&this->super_Parser,PP_WHITESPACE);
          } while (bVar1);
          bVar1 = Parser::test(&this->super_Parser,PP_RPAREN);
          iVar5 = 3;
          if (!bVar1) goto LAB_0012af43;
        }
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&arg.lex.d);
    }
    else {
      if (TVar3 == PP_RPAREN) break;
      local_78.size = -0x5555555555555556;
      local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_78.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      Parser::lexem((QByteArray *)&local_78,&this->super_Parser);
      arg._0_8_ = anon_var_dwarf_ee3c9;
      bVar1 = operator==((QByteArray *)&local_78,(char **)&arg);
      if (!bVar1) {
        pcVar4 = local_78.ptr;
        if (local_78.ptr == (char *)0x0) {
          pcVar4 = (char *)&QByteArray::_empty;
        }
        bVar2 = is_identifier(pcVar4,local_78.size);
        iVar5 = 0;
        if (bVar2) goto LAB_0012adce;
LAB_0012af3a:
        pcVar4 = "Unexpected character in macro argument list.";
LAB_0012af4a:
        Parser::error(&this->super_Parser,pcVar4);
      }
      m->isVariadic = true;
      iVar5 = (this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lineNum;
      QByteArray::QByteArray((QByteArray *)&local_c0,"__VA_ARGS__",-1);
      Symbol::Symbol(&arg,iVar5,IDENTIFIER,(QByteArray *)&local_c0);
      QList<Symbol>::emplaceBack<Symbol>((QList<Symbol> *)&local_58,&arg);
      QArrayDataPointer<char>::~QArrayDataPointer(&arg.lex.d);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_c0);
      do {
        bVar2 = Parser::test(&this->super_Parser,PP_WHITESPACE);
      } while (bVar2);
      bVar2 = Parser::test(&this->super_Parser,PP_RPAREN);
      iVar5 = 3;
      if (!bVar2) {
LAB_0012af43:
        pcVar4 = "missing \')\' in macro argument list";
        goto LAB_0012af4a;
      }
LAB_0012adce:
      QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
      if (!bVar1) goto LAB_0012addf;
    }
  } while (iVar5 != 3);
  QArrayDataPointer<Symbol>::operator=(&(m->arguments).d,&local_58);
  do {
    bVar1 = Parser::test(&this->super_Parser,PP_WHITESPACE);
  } while (bVar1);
  QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Preprocessor::parseDefineArguments(Macro *m)
{
    Symbols arguments;
    while (hasNext()) {
        while (test(PP_WHITESPACE)) {}
        Token t = next();
        if (t == PP_RPAREN)
            break;
        if (t != PP_IDENTIFIER) {
            QByteArray l = lexem();
            if (l == "...") {
                m->isVariadic = true;
                arguments += Symbol(symbol().lineNum, PP_IDENTIFIER, "__VA_ARGS__");
                while (test(PP_WHITESPACE)) {}
                if (!test(PP_RPAREN))
                    error("missing ')' in macro argument list");
                break;
            } else if (!is_identifier(l.constData(), l.size())) {
                error("Unexpected character in macro argument list.");
            }
        }

        Symbol arg = symbol();
        if (arguments.contains(arg))
            error("Duplicate macro parameter.");
        arguments += symbol();

        while (test(PP_WHITESPACE)) {}
        t = next();
        if (t == PP_RPAREN)
            break;
        if (t == PP_COMMA)
            continue;
        if (lexem() == "...") {
            //GCC extension:    #define FOO(x, y...) x(y)
            // The last argument was already parsed. Just mark the macro as variadic.
            m->isVariadic = true;
            while (test(PP_WHITESPACE)) {}
            if (!test(PP_RPAREN))
                error("missing ')' in macro argument list");
            break;
        }
        error("Unexpected character in macro argument list.");
    }
    m->arguments = arguments;
    while (test(PP_WHITESPACE)) {}
}